

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

color __thiscall
optimization::graph_color::Conflict_Map::available_color
          (Conflict_Map *this,
          set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
          *neighbors)

{
  color cVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  size_type sVar4;
  size_type __n;
  reference rVar5;
  VarId var;
  vector<bool,_std::allocator<bool>_> colors;
  allocator_type local_69;
  key_type local_68;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_68.super_Displayable._vptr_Displayable._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,(ulong)this->color_num,
             (bool *)&local_68,&local_69);
  for (p_Var3 = (neighbors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(neighbors->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_68.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    local_68.id = *(uint32_t *)&p_Var3[1]._M_parent;
    pmVar2 = std::
             map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
             ::at((this->color_map).
                  super___shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,&local_68);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,(long)*pmVar2);
    *rVar5._M_p = *rVar5._M_p & ~rVar5._M_mask;
  }
  __n = 0;
  do {
    local_68.super_Displayable._vptr_Displayable._0_4_ = (uint)__n;
    if (this->color_num <= (uint)__n) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/graph_color.hpp"
                    ,0x117,
                    "color optimization::graph_color::Conflict_Map::available_color(std::set<mir::inst::VarId> &)"
                   );
    }
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
    __n = __n + 1;
  } while ((*rVar5._M_p & rVar5._M_mask) == 0);
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                    ((this->unused_colors).
                     super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,(key_type *)&local_68);
  if (sVar4 != 0) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
              (&((this->unused_colors).
                 super___shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_M_t,(key_type *)&local_68);
  }
  cVar1 = (uint)local_68.super_Displayable._vptr_Displayable;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return cVar1;
}

Assistant:

color available_color(std::set<mir::inst::VarId>& neighbors) {
    std::vector<bool> colors(color_num, true);
    for (auto var : neighbors) {
      colors[color_map->at(var)] = false;
    }
    for (int i = 0; i < color_num; i++) {
      if (colors[i]) {
        if (unused_colors->count(i)) {
          unused_colors->erase(i);
        }
        return i;
      }
    }
    // errors
    assert(false);
    return 0;
  }